

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_60 [23];
  Voidify local_49;
  long local_48;
  long local_40;
  string *local_38;
  string *absl_log_internal_check_op_result;
  int64_t final_byte_count;
  int64_t target_byte_count;
  ConcatenatingInputStream *pCStack_18;
  int count_local;
  ConcatenatingInputStream *this_local;
  
  target_byte_count._4_4_ = count;
  pCStack_18 = this;
  while( true ) {
    if (this->stream_count_ < 1) {
      return false;
    }
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    final_byte_count = CONCAT44(extraout_var,iVar1) + (long)(int)target_byte_count._4_4_;
    uVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])
                      (*this->streams_,(ulong)target_byte_count._4_4_);
    if ((uVar2 & 1) != 0) break;
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    absl_log_internal_check_op_result = (string *)CONCAT44(extraout_var_00,iVar1);
    local_40 = absl::lts_20240722::log_internal::GetReferenceableValue
                         ((long)absl_log_internal_check_op_result);
    local_48 = absl::lts_20240722::log_internal::GetReferenceableValue(final_byte_count);
    local_38 = absl::lts_20240722::log_internal::Check_LTImpl<long,long>
                         (&local_40,&local_48,"final_byte_count < target_byte_count");
    if (local_38 != (string *)0x0) {
      auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0x145,auVar4._0_8_,auVar4._8_8_);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_60);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_49,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_60);
    }
    target_byte_count._4_4_ = (int)final_byte_count - (int)absl_log_internal_check_op_result;
    this->bytes_retired_ =
         (int64_t)(&absl_log_internal_check_op_result->_M_dataplus + this->bytes_retired_);
    this->streams_ = this->streams_ + 1;
    this->stream_count_ = this->stream_count_ + -1;
    local_38 = (string *)0x0;
  }
  return true;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64_t target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64_t final_byte_count = streams_[0]->ByteCount();
    ABSL_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}